

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

void __thiscall
pbrt::OrthographicCamera::OrthographicCamera
          (OrthographicCamera *this,CameraBaseParameters *baseParameters,Bounds2f *screenWindow,
          Float lensRadius,Float focalDistance)

{
  undefined8 uVar1;
  long in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Vector3<float> VVar5;
  Float in_stack_000002e0;
  Float in_stack_000002e4;
  Bounds2f *in_stack_000002e8;
  Transform *in_stack_000002f0;
  CameraBaseParameters *in_stack_000002f8;
  ProjectiveCamera *in_stack_00000300;
  float in_stack_fffffffffffffb68;
  float in_stack_fffffffffffffb6c;
  CameraBaseParameters *this_00;
  undefined8 local_454;
  undefined4 local_44c;
  Vector3<float> *in_stack_fffffffffffffc78;
  Float in_stack_fffffffffffffc80;
  Float in_stack_fffffffffffffc84;
  CameraBaseParameters local_370;
  undefined1 auVar4 [56];
  
  this_00 = &local_370;
  CameraBaseParameters::CameraBaseParameters
            (this_00,(CameraBaseParameters *)
                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  Orthographic(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80);
  ProjectiveCamera::ProjectiveCamera
            (in_stack_00000300,in_stack_000002f8,in_stack_000002f0,in_stack_000002e8,
             in_stack_000002e4,in_stack_000002e0);
  Vector3<float>::Vector3((Vector3<float> *)0x57e2e9);
  Vector3<float>::Vector3((Vector3<float> *)0x57e2fa);
  auVar4 = (undefined1  [56])0x0;
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,0.0);
  VVar5 = Transform::operator()
                    ((Transform *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc78);
  auVar2._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  *(float *)(in_RDI + 0x590) = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined8 *)(in_RDI + 0x588) = uVar1;
  auVar4 = ZEXT856(0);
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,0.0);
  VVar5 = Transform::operator()
                    ((Transform *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     in_stack_fffffffffffffc78);
  auVar3._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  *(undefined8 *)(in_RDI + 0x594) = uVar1;
  *(float *)(in_RDI + 0x59c) = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,0.0);
  *(undefined8 *)(in_RDI + 0x374) = local_454;
  *(undefined4 *)(in_RDI + 0x37c) = local_44c;
  *(undefined8 *)(in_RDI + 0x368) = *(undefined8 *)(in_RDI + 0x374);
  *(undefined4 *)(in_RDI + 0x370) = *(undefined4 *)(in_RDI + 0x37c);
  *(undefined8 *)(in_RDI + 0x350) = *(undefined8 *)(in_RDI + 0x588);
  *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(in_RDI + 0x590);
  *(undefined8 *)(in_RDI + 0x35c) = *(undefined8 *)(in_RDI + 0x594);
  *(undefined4 *)(in_RDI + 0x364) = *(undefined4 *)(in_RDI + 0x59c);
  return;
}

Assistant:

OrthographicCamera(CameraBaseParameters baseParameters, const Bounds2f &screenWindow,
                       Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Orthographic(0, 1), screenWindow, lensRadius,
                           focalDistance) {
        // Compute differential changes in origin for orthographic camera rays
        dxCamera = cameraFromRaster(Vector3f(1, 0, 0));
        dyCamera = cameraFromRaster(Vector3f(0, 1, 0));

        // Compute minimum differentials for orthographic camera
        minDirDifferentialX = minDirDifferentialY = Vector3f(0, 0, 0);
        minPosDifferentialX = dxCamera;
        minPosDifferentialY = dyCamera;
    }